

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_icon.cpp
# Opt level: O3

ComponentIcon * lsim::gui::ComponentIcon::cache(uint32_t id,char *data,size_t len)

{
  ComponentIcon *this;
  default_delete<lsim::gui::ComponentIcon> *this_00;
  iterator iVar1;
  ComponentIcon *pCVar2;
  pointer __p;
  pointer *__ptr;
  ComponentIcon *local_28;
  uint32_t local_1c;
  
  local_1c = id;
  this = (ComponentIcon *)operator_new(0x20);
  ComponentIcon(this,data,len);
  local_28 = this;
  this_00 = (default_delete<lsim::gui::ComponentIcon> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)m_icon_cache,&local_1c);
  local_28 = (ComponentIcon *)0x0;
  pCVar2 = *(ComponentIcon **)this_00;
  *(ComponentIcon **)this_00 = this;
  if (pCVar2 != (ComponentIcon *)0x0) {
    std::default_delete<lsim::gui::ComponentIcon>::operator()(this_00,pCVar2);
  }
  if (local_28 != (ComponentIcon *)0x0) {
    std::default_delete<lsim::gui::ComponentIcon>::operator()
              ((default_delete<lsim::gui::ComponentIcon> *)&local_28,local_28);
  }
  local_28 = (ComponentIcon *)CONCAT44(local_28._4_4_,local_1c);
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)m_icon_cache,(key_type *)&local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pCVar2 = (ComponentIcon *)0x0;
  }
  else {
    pCVar2 = *(ComponentIcon **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_false>
                     ._M_cur + 0x10);
  }
  return pCVar2;
}

Assistant:

ComponentIcon* ComponentIcon::cache(uint32_t id, const char* data, size_t len) {
	m_icon_cache[id] = std::make_unique<ComponentIcon>(data, len);
	return cached(id);
}